

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

float Search::action_hamming_loss(action a,action *A,size_t sz)

{
  action *paVar1;
  size_t sVar2;
  
  if (sz != 0) {
    sVar2 = 0;
    do {
      if (sz == sVar2) {
        return 1.0;
      }
      paVar1 = A + sVar2;
      sVar2 = sVar2 + 1;
    } while (*paVar1 != a);
  }
  return 0.0;
}

Assistant:

float action_hamming_loss(action a, const action* A, size_t sz)
{
  if (sz == 0)
    return 0.;  // latent variables have zero loss
  for (size_t i = 0; i < sz; i++)
    if (a == A[i])
      return 0.;
  return 1.;
}